

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGComputeInterleaves(void *payload,void *data,xmlChar *name)

{
  xmlRelaxNGDefinePtr_conflict def;
  long lVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  xmlRelaxNGDefinePtr *ppxVar5;
  void *pvVar6;
  undefined8 *puVar7;
  xmlRelaxNGDefinePtr_conflict *ppxVar8;
  int *piVar9;
  xmlHashTablePtr pxVar10;
  void *pvVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_00;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_01;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_02;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_03;
  xmlChar *key2;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_04;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_05;
  xmlRelaxNGDefinePtr *ppxVar16;
  void *pvVar17;
  char *key;
  size_t sVar18;
  void *pvVar19;
  uint uVar20;
  ulong uVar21;
  void *local_38;
  
  if (*(int *)((long)data + 0x44) == 0) {
    sVar18 = 0;
    ppxVar16 = (xmlRelaxNGDefinePtr *)((long)payload + 0x30);
    for (ppxVar5 = ppxVar16; *ppxVar5 != (xmlRelaxNGDefinePtr)0x0; ppxVar5 = &(*ppxVar5)->next) {
      sVar18 = sVar18 + 8;
    }
    pvVar6 = (*xmlMalloc)(sVar18);
    if (pvVar6 == (void *)0x0) {
      pvVar19 = (void *)0x0;
    }
    else {
      iVar15 = 0;
      pvVar19 = (void *)0x0;
      while (def = *ppxVar16, def != (xmlRelaxNGDefinePtr_conflict)0x0) {
        puVar7 = (undefined8 *)(*xmlMalloc)(0x18);
        *(undefined8 **)((long)pvVar6 + (long)pvVar19 * 8) = puVar7;
        if (puVar7 == (undefined8 *)0x0) goto LAB_00178dde;
        iVar15 = iVar15 + (uint)(def->type == XML_RELAXNG_TEXT);
        *puVar7 = def;
        ppxVar8 = xmlRelaxNGGetElements((xmlRelaxNGParserCtxtPtr)data,def,2);
        *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar6 + (long)pvVar19 * 8) + 8) =
             ppxVar8;
        ppxVar8 = xmlRelaxNGGetElements((xmlRelaxNGParserCtxtPtr)data,def,1);
        *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar6 + (long)pvVar19 * 8) + 0x10) =
             ppxVar8;
        pvVar19 = (void *)((long)pvVar19 + 1);
        ppxVar16 = &def->next;
      }
      piVar9 = (int *)(*xmlMalloc)(0x20);
      if (piVar9 != (int *)0x0) {
        piVar9[0] = 0;
        piVar9[1] = 0;
        piVar9[2] = 0;
        piVar9[3] = 0;
        piVar9[4] = 0;
        piVar9[5] = 0;
        piVar9[6] = 0;
        piVar9[7] = 0;
        *piVar9 = (int)pvVar19;
        pxVar10 = xmlHashCreate((int)pvVar19);
        *(xmlHashTablePtr *)(piVar9 + 2) = pxVar10;
        local_38 = (void *)0x1;
        pvVar11 = (void *)0x0;
        ppxVar8 = extraout_RDX;
        uVar20 = 1;
        do {
          if (pvVar19 == pvVar11) {
            *(void **)(piVar9 + 6) = pvVar6;
            *(int **)((long)payload + 0x28) = piVar9;
            if (iVar15 != 0) {
              *(byte *)((long)payload + 0x62) = *(byte *)((long)payload + 0x62) | 8;
            }
            if (uVar20 != 2) {
              if (uVar20 != 1) {
                return;
              }
              piVar9[4] = 1;
              return;
            }
            piVar9[4] = 3;
            return;
          }
          lVar1 = *(long *)((long)pvVar6 + (long)pvVar11 * 8);
          for (pvVar17 = local_38; pvVar17 < pvVar19; pvVar17 = (void *)((long)pvVar17 + 1)) {
            lVar2 = *(long *)((long)pvVar6 + (long)pvVar17 * 8);
            if (lVar2 != 0) {
              iVar4 = xmlRelaxNGCompareElemDefLists
                                (*(xmlRelaxNGParserCtxtPtr *)(lVar1 + 8),
                                 *(xmlRelaxNGDefinePtr_conflict **)(lVar2 + 8),ppxVar8);
              ppxVar8 = extraout_RDX_00;
              if (iVar4 == 0) {
                xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3fd,
                           "Element or text conflicts in interleave\n",(xmlChar *)0x0,(xmlChar *)0x0
                          );
                ppxVar8 = extraout_RDX_01;
              }
              iVar4 = xmlRelaxNGCompareElemDefLists
                                (*(xmlRelaxNGParserCtxtPtr *)(lVar1 + 0x10),
                                 *(xmlRelaxNGDefinePtr_conflict **)
                                  (*(long *)((long)pvVar6 + (long)pvVar17 * 8) + 0x10),ppxVar8);
              ppxVar8 = extraout_RDX_02;
              if (iVar4 == 0) {
                xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3e9,
                           "Attributes conflicts in interleave\n",(xmlChar *)0x0,(xmlChar *)0x0);
                ppxVar8 = extraout_RDX_03;
              }
            }
          }
          pvVar11 = (void *)((long)pvVar11 + 1);
          plVar3 = *(long **)(lVar1 + 8);
          uVar14 = 0;
          if ((plVar3 != (long *)0x0) && (puVar12 = (uint *)*plVar3, puVar12 != (uint *)0x0)) {
            while (uVar14 = uVar20, puVar12 != (uint *)0x0) {
              uVar14 = *puVar12;
              ppxVar8 = (xmlRelaxNGDefinePtr_conflict *)(ulong)uVar14;
              if (uVar14 == 4) {
                key = *(char **)(puVar12 + 4);
                key2 = *(xmlChar **)(puVar12 + 6);
                if ((xmlChar *)key == (xmlChar *)0x0) {
                  if (key2 == (xmlChar *)0x0) {
                    pxVar10 = *(xmlHashTablePtr *)(piVar9 + 2);
LAB_00178d9f:
                    key2 = (xmlChar *)0x0;
                  }
                  else {
                    pxVar10 = *(xmlHashTablePtr *)(piVar9 + 2);
                    if (*key2 == '\0') goto LAB_00178d9f;
                  }
                  iVar4 = xmlHashAddEntry2(pxVar10,"#any",key2,pvVar11);
                  ppxVar8 = extraout_RDX_05;
                  if (*(long *)(*plVar3 + 0x50) != 0) {
                    uVar20 = 2;
                  }
                }
                else {
                  if (key2 == (xmlChar *)0x0) {
                    pxVar10 = *(xmlHashTablePtr *)(piVar9 + 2);
LAB_00178d3e:
                    key2 = (xmlChar *)0x0;
                  }
                  else {
                    pxVar10 = *(xmlHashTablePtr *)(piVar9 + 2);
                    if (*key2 == '\0') goto LAB_00178d3e;
                  }
                  iVar4 = xmlHashAddEntry2(pxVar10,(xmlChar *)key,key2,pvVar11);
                  ppxVar8 = extraout_RDX_04;
                }
                uVar13 = -(uint)(iVar4 != 0) | uVar20;
              }
              else {
                uVar13 = 0xffffffff;
                if (uVar14 == 3) {
                  pxVar10 = *(xmlHashTablePtr *)(piVar9 + 2);
                  key = "#text";
                  goto LAB_00178d3e;
                }
              }
              puVar12 = (uint *)plVar3[1];
              plVar3 = plVar3 + 1;
              uVar20 = uVar13;
            }
          }
          local_38 = (void *)((long)local_38 + 1);
          uVar20 = uVar14;
        } while( true );
      }
    }
LAB_00178dde:
    xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)data);
    if (pvVar6 != (void *)0x0) {
      for (uVar21 = 0; ((ulong)pvVar19 & 0xffffffff) != uVar21; uVar21 = uVar21 + 1) {
        pvVar11 = *(void **)((long)pvVar6 + uVar21 * 8);
        if (pvVar11 != (void *)0x0) {
          if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
            (*xmlFree)(*(void **)((long)pvVar11 + 8));
            pvVar11 = *(void **)((long)pvVar6 + uVar21 * 8);
          }
          (*xmlFree)(pvVar11);
        }
      }
      (*xmlFree)(pvVar6);
      return;
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGComputeInterleaves(void *payload, void *data,
                             const xmlChar * name ATTRIBUTE_UNUSED)
{
    xmlRelaxNGDefinePtr def = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlRelaxNGDefinePtr cur, *tmp;

    xmlRelaxNGPartitionPtr partitions = NULL;
    xmlRelaxNGInterleaveGroupPtr *groups = NULL;
    xmlRelaxNGInterleaveGroupPtr group;
    int i, j, ret, res;
    int nbgroups = 0;
    int nbchild = 0;
    int is_mixed = 0;
    int is_determinist = 1;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return;

    cur = def->content;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }

    groups = (xmlRelaxNGInterleaveGroupPtr *)
        xmlMalloc(nbchild * sizeof(xmlRelaxNGInterleaveGroupPtr));
    if (groups == NULL)
        goto error;
    cur = def->content;
    while (cur != NULL) {
        groups[nbgroups] = (xmlRelaxNGInterleaveGroupPtr)
            xmlMalloc(sizeof(xmlRelaxNGInterleaveGroup));
        if (groups[nbgroups] == NULL)
            goto error;
        if (cur->type == XML_RELAXNG_TEXT)
            is_mixed++;
        groups[nbgroups]->rule = cur;
        groups[nbgroups]->defs = xmlRelaxNGGetElements(ctxt, cur, 2);
        groups[nbgroups]->attrs = xmlRelaxNGGetElements(ctxt, cur, 1);
        nbgroups++;
        cur = cur->next;
    }

    /*
     * Let's check that all rules makes a partitions according to 7.4
     */
    partitions = (xmlRelaxNGPartitionPtr)
        xmlMalloc(sizeof(xmlRelaxNGPartition));
    if (partitions == NULL)
        goto error;
    memset(partitions, 0, sizeof(xmlRelaxNGPartition));
    partitions->nbgroups = nbgroups;
    partitions->triage = xmlHashCreate(nbgroups);
    for (i = 0; i < nbgroups; i++) {
        group = groups[i];
        for (j = i + 1; j < nbgroups; j++) {
            if (groups[j] == NULL)
                continue;

            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->defs,
                                                groups[j]->defs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ELEM_TEXT_CONFLICT,
                           "Element or text conflicts in interleave\n",
                           NULL, NULL);
            }
            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->attrs,
                                                groups[j]->attrs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ATTR_CONFLICT,
                           "Attributes conflicts in interleave\n", NULL,
                           NULL);
            }
        }
        tmp = group->defs;
        if ((tmp != NULL) && (*tmp != NULL)) {
            while (*tmp != NULL) {
                if ((*tmp)->type == XML_RELAXNG_TEXT) {
                    res = xmlHashAddEntry2(partitions->triage,
                                           BAD_CAST "#text", NULL,
                                           XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if (((*tmp)->type == XML_RELAXNG_ELEMENT) &&
                           ((*tmp)->name != NULL)) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if ((*tmp)->type == XML_RELAXNG_ELEMENT) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if ((*tmp)->nameClass != NULL)
                        is_determinist = 2;
                    if (res != 0)
                        is_determinist = -1;
                } else {
                    is_determinist = -1;
                }
                tmp++;
            }
        } else {
            is_determinist = 0;
        }
    }
    partitions->groups = groups;

    /*
     * and save the partition list back in the def
     */
    def->data = partitions;
    if (is_mixed != 0)
        def->dflags |= IS_MIXED;
    if (is_determinist == 1)
        partitions->flags = IS_DETERMINIST;
    if (is_determinist == 2)
        partitions->flags = IS_DETERMINIST | IS_NEEDCHECK;
    return;

  error:
    xmlRngPErrMemory(ctxt);
    if (groups != NULL) {
        for (i = 0; i < nbgroups; i++)
            if (groups[i] != NULL) {
                if (groups[i]->defs != NULL)
                    xmlFree(groups[i]->defs);
                xmlFree(groups[i]);
            }
        xmlFree(groups);
    }
    xmlRelaxNGFreePartition(partitions);
}